

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O0

CharType onmt::unicode::get_char_type(int8_t category)

{
  int8_t category_local;
  CharType local_4;
  
  switch(category) {
  case '\x01':
  case '\x02':
  case '\x03':
  case '\x04':
  case '\x05':
    local_4 = Letter;
    break;
  case '\x06':
  case '\a':
  case '\b':
    local_4 = Mark;
    break;
  case '\t':
  case '\n':
  case '\v':
    local_4 = Number;
    break;
  case '\f':
  case '\r':
  case '\x0e':
    local_4 = Separator;
    break;
  default:
    local_4 = Other;
  }
  return local_4;
}

Assistant:

static inline CharType get_char_type(const int8_t category)
    {
      switch (category)
      {
      case U_SPACE_SEPARATOR:
      case U_LINE_SEPARATOR:
      case U_PARAGRAPH_SEPARATOR:
        return CharType::Separator;

      case U_DECIMAL_DIGIT_NUMBER:
      case U_LETTER_NUMBER:
      case U_OTHER_NUMBER:
        return CharType::Number;

      case U_UPPERCASE_LETTER:
      case U_LOWERCASE_LETTER:
      case U_TITLECASE_LETTER:
      case U_MODIFIER_LETTER:
      case U_OTHER_LETTER:
        return CharType::Letter;

      case U_NON_SPACING_MARK:
      case U_ENCLOSING_MARK:
      case U_COMBINING_SPACING_MARK:
        return CharType::Mark;

      default:
        return CharType::Other;
      }
    }